

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O2

FunctionCodeGenJitTimeData * __thiscall
Js::FunctionCodeGenJitTimeData::AddCallApplyTargetInlinee
          (FunctionCodeGenJitTimeData *this,Recycler *recycler,ProfileId profiledCallSiteId,
          ProfileId callApplyCallSiteId,FunctionInfo *inlinee)

{
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  undefined4 *puVar4;
  FunctionBody *this_00;
  Recycler *this_01;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *pWVar5;
  FunctionCodeGenJitTimeData *ptr;
  Type *this_02;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xd8,"(recycler != nullptr)","recycler != nullptr");
    if (!bVar2) goto LAB_00414fe0;
    *puVar4 = 0;
  }
  this_00 = GetFunctionBody(this);
  if (this_00 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    data._32_8_ = recycler;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xda,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar2) goto LAB_00414fe0;
    *puVar4 = 0;
    recycler = (Recycler *)data._32_8_;
  }
  if (this_00->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xdb,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar2) goto LAB_00414fe0;
    *puVar4 = 0;
  }
  PVar3 = FunctionBody::GetProfiledCallApplyCallSiteCount(this_00);
  if (PVar3 <= callApplyCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xdc,
                                "(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount())"
                                ,
                                "callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount()"
                               );
    if (!bVar2) goto LAB_00414fe0;
    *puVar4 = 0;
  }
  if (inlinee == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xdd,"(inlinee != nullptr)","inlinee != nullptr");
    if (!bVar2) goto LAB_00414fe0;
    *puVar4 = 0;
  }
  pWVar5 = (this->callApplyTargetInlinees).ptr;
  this_02 = &this->callApplyTargetInlinees;
  if (pWVar5 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    PVar3 = FunctionBody::GetProfiledCallApplyCallSiteCount(this_00);
    data.plusSize = (size_t)PVar3;
    local_68 = (undefined1  [8])&Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_d3658c;
    data.filename._0_4_ = 0xe1;
    this_01 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_68);
    PVar3 = FunctionBody::GetProfiledCallApplyCallSiteCount(this_00);
    pWVar5 = Memory::
             AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>,false>
                       ((Memory *)this_01,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)PVar3);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>_>::
    WriteBarrierSet(this_02,pWVar5);
    pWVar5 = this_02->ptr;
  }
  if (pWVar5[callApplyCallSiteId].ptr != (FunctionCodeGenJitTimeData *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xe5,"(callApplyTargetInlinees[callApplyCallSiteId] == nullptr)",
                                "callApplyTargetInlinees[callApplyCallSiteId] == nullptr");
    if (!bVar2) {
LAB_00414fe0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  ptr = New(recycler,inlinee,(EntryPointInfo *)0x0,true);
  Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::WriteBarrierSet
            (this_02->ptr + callApplyCallSiteId,ptr);
  return ptr;
}

Assistant:

FunctionCodeGenJitTimeData * FunctionCodeGenJitTimeData::AddCallApplyTargetInlinee(
        Recycler *const recycler,
        const ProfileId profiledCallSiteId,
        const ProfileId callApplyCallSiteId,
        FunctionInfo *const inlinee)
    {
        Assert(recycler != nullptr);
        FunctionBody * functionBody = GetFunctionBody();
        Assert(functionBody != nullptr);
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());
        Assert(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount());
        Assert(inlinee != nullptr);

        if (!callApplyTargetInlinees)
        {
            callApplyTargetInlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenJitTimeData *), functionBody->GetProfiledCallApplyCallSiteCount());
        }

        // Polymorphic call/apply targets are not inlined.
        Assert(callApplyTargetInlinees[callApplyCallSiteId] == nullptr);

        FunctionCodeGenJitTimeData * inlineeData = FunctionCodeGenJitTimeData::New(recycler, inlinee, nullptr /* entryPoint */, true /*isInlined*/);
        callApplyTargetInlinees[callApplyCallSiteId] = inlineeData;
        return inlineeData;
    }